

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O0

void __thiscall Hpipe::CharGraph::CharGraph(CharGraph *this,Lexer *lexer)

{
  ulong uVar1;
  undefined1 local_48 [8];
  string method;
  Lexer *lexer_local;
  CharGraph *this_local;
  
  this->ok = true;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Vec
            (&this->methods);
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Vec
            (&this->includes);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
  ::map(&this->variables);
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Vec
            (&this->preliminaries);
  this->lexer = lexer;
  CharItem::CharItem(&this->base,7);
  this->nb_scopes = 0;
  Vec<Hpipe::CharGraph::WaitGoto>::Vec(&this->gotos);
  Vec<Hpipe::CharGraph::Label>::Vec(&this->labels);
  Pool<Hpipe::Lexem,_32>::Pool(&this->le_pool);
  Pool<Hpipe::CharItem,_32>::Pool(&this->ci_pool);
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Vec
            (&this->calls);
  Lexer::methods_abi_cxx11_((string *)local_48,lexer);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Vec<std::__cxx11::string>::push_back_unique<std::__cxx11::string&>
              ((Vec<std::__cxx11::string> *)&this->methods,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

CharGraph::CharGraph( Lexer &lexer ) : ok( true ), lexer( lexer ), base( CharItem::BEGIN ) {
    std::string method = lexer.methods();
    if ( ! method.empty() )
        methods.push_back_unique( method );
}